

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O2

pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_>
* __thiscall
jessilib::
split_once<std::basic_string_view<char32_t,std::char_traits<char32_t>>,char32_t_const*,char32_t_const*,char32_t>
          (pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_>
           *__return_storage_ptr__,jessilib *this,char32_t *begin,char32_t *end,char32_t in_delim)

{
  long lVar1;
  
  if (begin <= this) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char32_t *)0x0;
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char32_t *)0x0;
    return __return_storage_ptr__;
  }
  lVar1 = 0;
  while( true ) {
    if (this + lVar1 == (jessilib *)begin) {
      (__return_storage_ptr__->first)._M_len = (long)begin - (long)this >> 2;
      (__return_storage_ptr__->first)._M_str = (char32_t *)this;
      (__return_storage_ptr__->second)._M_len = 0;
      (__return_storage_ptr__->second)._M_str = (char32_t *)0x0;
      return __return_storage_ptr__;
    }
    if (*(char32_t *)(this + lVar1) == (char32_t)end) break;
    lVar1 = lVar1 + 4;
  }
  (__return_storage_ptr__->first)._M_len = lVar1 >> 2;
  (__return_storage_ptr__->first)._M_str = (char32_t *)this;
  (__return_storage_ptr__->second)._M_len = (long)begin + (-lVar1 - (long)this) + -4 >> 2;
  (__return_storage_ptr__->second)._M_str = (char32_t *)(this + lVar1 + 4);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}